

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O2

HRESULT __thiscall
Diligent::anon_unknown_0::DxcIncludeHandlerImpl::LoadSource
          (DxcIncludeHandlerImpl *this,LPCWSTR pFilename,IDxcBlob **ppIncludeSource)

{
  IDxcLibrary *pIVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  void *pvVar4;
  size_t sVar5;
  char (*Args_2) [2];
  HRESULT HVar6;
  RefCntAutoPtr<Diligent::DataBlobImpl> pFileData;
  CComPtr<IDxcBlobEncoding> pSourceBlob;
  RefCntAutoPtr<Diligent::IFileStream> pSourceStream;
  String fileName;
  string _msg;
  
  HVar6 = -0x7ff8ffa9;
  if (ppIncludeSource != (IDxcBlob **)0x0 && pFilename != (LPCWSTR)0x0) {
    *ppIncludeSource = (IDxcBlob *)0x0;
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    fileName._M_string_length = 0;
    fileName.field_2._M_local_buf[0] = '\0';
    wcslen(pFilename);
    std::__cxx11::string::resize((ulong)&fileName);
    for (uVar3 = 0; uVar3 < fileName._M_string_length; uVar3 = uVar3 + 1) {
      fileName._M_dataplus._M_p[uVar3] = (char)pFilename[uVar3];
    }
    if (fileName._M_string_length == 0) {
      HVar6 = -0x7fffbffb;
      LogError<false,char[44],std::__cxx11::string,char[32]>
                (false,"LoadSource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
                 ,200,(char (*) [44])"Failed to convert shader include file name ",&fileName,
                 (char (*) [32])". File name must be ANSI string");
    }
    else {
      if (((2 < fileName._M_string_length) && (*fileName._M_dataplus._M_p == '.')) &&
         ((fileName._M_dataplus._M_p[1] == '\\' || (fileName._M_dataplus._M_p[1] == '/')))) {
        std::__cxx11::string::erase((ulong)&fileName,0);
      }
      _msg._M_string_length = (size_type)&pSourceStream;
      pSourceStream.m_pObject = (IFileStream *)0x0;
      _msg._M_dataplus._M_p = (pointer)0x0;
      (*(this->m_pStreamFactory->super_IObject)._vptr_IObject[4])();
      RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
                ((DoublePtrHelper<Diligent::IFileStream> *)&_msg);
      if (pSourceStream.m_pObject == (IFileStream *)0x0) {
        HVar6 = -0x7fffbffb;
        LogError<false,char[36],std::__cxx11::string,char[29]>
                  (false,"LoadSource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
                   ,0xd4,(char (*) [36])"Failed to open shader include file ",&fileName,
                   (char (*) [29])0x5ddd4f);
      }
      else {
        DataBlobImpl::Create((DataBlobImpl *)&pFileData,0,(void *)0x0);
        (*((pSourceStream.m_pObject)->super_IObject)._vptr_IObject[5])();
        pSourceBlob.super_CComPtrBase<IDxcBlobEncoding>.p =
             (CComPtrBase<IDxcBlobEncoding>)(IDxcBlobEncoding *)0x0;
        pIVar1 = (this->m_pdxcLibrary).super_CComPtrBase<IDxcLibrary>.p;
        pvVar4 = DataBlobImpl::GetDataPtr(pFileData.m_pObject,0);
        sVar5 = DataBlobImpl::GetSize(pFileData.m_pObject);
        Args_2 = (char (*) [2])
                 CComPtrBase<IDxcBlobEncoding>::operator&
                           (&pSourceBlob.super_CComPtrBase<IDxcBlobEncoding>);
        iVar2 = (**(code **)(*(long *)pIVar1 + 0x30))(pIVar1,pvVar4,sVar5 & 0xffffffff,0xfde9);
        if (iVar2 < 0) {
          FormatString<char[50],std::__cxx11::string,char[2]>
                    (&_msg,(Diligent *)"Failed to allocate space for shader include file ",
                     (char (*) [50])&fileName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x665ed2,
                     Args_2);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
          }
          std::__cxx11::string::~string((string *)&_msg);
          HVar6 = -0x7fffbffb;
        }
        else {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IDataBlob>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDataBlob>>>
          ::emplace_back<Diligent::RefCntAutoPtr<Diligent::DataBlobImpl>>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IDataBlob>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDataBlob>>>
                      *)&this->m_FileDataCache,&pFileData);
          HVar6 = 0;
          (*(code *)**(undefined8 **)pSourceBlob.super_CComPtrBase<IDxcBlobEncoding>.p)
                    (pSourceBlob.super_CComPtrBase<IDxcBlobEncoding>.p,
                     _GUID_8ba5fb08_5195_40e2_ac58_0d989c3a0102,ppIncludeSource);
        }
        CComPtrBase<IDxcBlobEncoding>::~CComPtrBase
                  (&pSourceBlob.super_CComPtrBase<IDxcBlobEncoding>);
        RefCntAutoPtr<Diligent::DataBlobImpl>::Release(&pFileData);
      }
      RefCntAutoPtr<Diligent::IFileStream>::Release(&pSourceStream);
    }
    std::__cxx11::string::~string((string *)&fileName);
  }
  return HVar6;
}

Assistant:

LoadSource(_In_ LPCWSTR pFilename, _COM_Outptr_result_maybenull_ IDxcBlob** ppIncludeSource) override
    {
        if (pFilename == nullptr)
            return E_INVALIDARG;


        if (ppIncludeSource == nullptr)
            return E_INVALIDARG;

        *ppIncludeSource = nullptr;

        String fileName;
        fileName.resize(wcslen(pFilename));
        for (size_t i = 0; i < fileName.size(); ++i)
        {
            fileName[i] = static_cast<char>(pFilename[i]);
        }

        if (fileName.empty())
        {
            LOG_ERROR("Failed to convert shader include file name ", fileName, ". File name must be ANSI string");
            return E_FAIL;
        }

        // validate file name
        if (fileName.size() > 2 && fileName[0] == '.' && (fileName[1] == '\\' || fileName[1] == '/'))
            fileName.erase(0, 2);

        RefCntAutoPtr<IFileStream> pSourceStream;
        m_pStreamFactory->CreateInputStream(fileName.c_str(), &pSourceStream);
        if (pSourceStream == nullptr)
        {
            LOG_ERROR("Failed to open shader include file ", fileName, ". Check that the file exists");
            return E_FAIL;
        }

        RefCntAutoPtr<DataBlobImpl> pFileData = DataBlobImpl::Create();
        pSourceStream->ReadBlob(pFileData);

        CComPtr<IDxcBlobEncoding> pSourceBlob;

        HRESULT hr = m_pdxcLibrary->CreateBlobWithEncodingFromPinned(pFileData->GetDataPtr(), static_cast<UINT32>(pFileData->GetSize()), CP_UTF8, &pSourceBlob);
        if (FAILED(hr))
        {
            LOG_ERROR_MESSAGE("Failed to allocate space for shader include file ", fileName, ".");
            return E_FAIL;
        }

        m_FileDataCache.emplace_back(std::move(pFileData));

        pSourceBlob->QueryInterface(IID_PPV_ARGS(ppIncludeSource));
        return S_OK;
    }